

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O3

void psh_globals_set_scale
               (PSH_Globals globals,FT_Fixed x_scale,FT_Fixed y_scale,FT_Fixed x_delta,
               FT_Fixed y_delta)

{
  PSH_BluesRec *pPVar1;
  FT_Pos FVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  FT_UInt FVar7;
  PSH_BluesRec *pPVar8;
  PSH_Blue_ZoneRec *pPVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  FT_Pos *pFVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  if ((globals->dimension[0].scale_mult != x_scale) ||
     (globals->dimension[0].scale_delta != x_delta)) {
    globals->dimension[0].scale_mult = x_scale;
    globals->dimension[0].scale_delta = x_delta;
    psh_globals_scale_widths(globals,0);
  }
  if ((globals->dimension[1].scale_mult != y_scale) ||
     (globals->dimension[1].scale_delta != y_delta)) {
    globals->dimension[1].scale_mult = y_scale;
    globals->dimension[1].scale_delta = y_delta;
    psh_globals_scale_widths(globals,1);
    if (y_scale < 0x20c49ba) {
      bVar4 = y_scale * 0x7d < (globals->blues).blue_scale * 8;
    }
    else {
      bVar4 = y_scale < ((globals->blues).blue_scale << 3) / 0x7d;
    }
    (globals->blues).no_overshoots = bVar4;
    uVar6 = (globals->blues).blue_shift;
    lVar5 = (long)(int)y_scale;
    if (0 < (int)uVar6) {
      do {
        if ((int)((ulong)uVar6 * lVar5 + ((long)((ulong)uVar6 * lVar5) >> 0x3f) + 0x8000 >> 0x10) <
            0x21) goto LAB_001569db;
        bVar4 = 1 < (int)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar4);
      uVar6 = 0;
    }
LAB_001569db:
    pPVar1 = &globals->blues;
    (globals->blues).blue_threshold = uVar6;
    iVar10 = 0;
    do {
      pPVar8 = pPVar1;
      if (((iVar10 != 0) && (pPVar8 = (PSH_BluesRec *)&(globals->blues).family_top, iVar10 != 2)) &&
         (pPVar8 = (PSH_BluesRec *)&(globals->blues).normal_bottom, iVar10 != 1)) {
        pPVar8 = (PSH_BluesRec *)&(globals->blues).family_bottom;
      }
      FVar7 = (pPVar8->normal_top).count;
      if (FVar7 != 0) {
        pPVar9 = (pPVar8->normal_top).zones;
        do {
          lVar15 = pPVar9->org_top * lVar5;
          pPVar9->cur_top = (int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10) + y_delta;
          lVar15 = pPVar9->org_bottom * lVar5;
          pPVar9->cur_bottom = (int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10) + y_delta;
          lVar16 = pPVar9->org_ref * lVar5;
          lVar15 = pPVar9->org_delta * lVar5;
          pPVar9->cur_delta = (long)(int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10);
          pPVar9->cur_ref =
               (long)(int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10) + y_delta + 0x20 &
               0xffffffffffffffc0;
          pPVar9 = pPVar9 + 1;
          FVar7 = FVar7 - 1;
        } while (FVar7 != 0);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 4);
    bVar4 = true;
    do {
      bVar3 = bVar4;
      pPVar8 = (PSH_BluesRec *)&(globals->blues).normal_bottom;
      if (bVar3) {
        pPVar8 = pPVar1;
      }
      FVar7 = (pPVar8->normal_top).count;
      if (FVar7 != 0) {
        pPVar9 = (pPVar8->normal_top).zones;
        lVar15 = 0x918;
        if (bVar3) {
          lVar15 = 0x610;
        }
        iVar10 = *(int *)((long)(pPVar1->normal_top).zones + lVar15 + -8);
        do {
          if (iVar10 != 0) {
            pFVar13 = (FT_Pos *)((long)&(globals->blues).normal_top.zones[0].cur_bottom + lVar15);
            iVar14 = iVar10;
            do {
              iVar11 = pPVar9->org_ref - (int)pFVar13[-4];
              iVar12 = -iVar11;
              if (0 < iVar11) {
                iVar12 = iVar11;
              }
              if ((int)((ulong)(iVar12 * lVar5 + (iVar12 * lVar5 >> 0x3f) + 0x8000) >> 0x10) < 0x40)
              {
                FVar2 = pFVar13[1];
                pPVar9->cur_bottom = *pFVar13;
                pPVar9->cur_top = FVar2;
                FVar2 = pFVar13[-1];
                pPVar9->cur_ref = pFVar13[-2];
                pPVar9->cur_delta = FVar2;
                break;
              }
              pFVar13 = pFVar13 + 6;
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          pPVar9 = pPVar9 + 1;
          FVar7 = FVar7 - 1;
        } while (FVar7 != 0);
      }
      bVar4 = false;
    } while (bVar3);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  psh_globals_set_scale( PSH_Globals  globals,
                         FT_Fixed     x_scale,
                         FT_Fixed     y_scale,
                         FT_Fixed     x_delta,
                         FT_Fixed     y_delta )
  {
    PSH_Dimension  dim;


    dim = &globals->dimension[0];
    if ( x_scale != dim->scale_mult  ||
         x_delta != dim->scale_delta )
    {
      dim->scale_mult  = x_scale;
      dim->scale_delta = x_delta;

      psh_globals_scale_widths( globals, 0 );
    }

    dim = &globals->dimension[1];
    if ( y_scale != dim->scale_mult  ||
         y_delta != dim->scale_delta )
    {
      dim->scale_mult  = y_scale;
      dim->scale_delta = y_delta;

      psh_globals_scale_widths( globals, 1 );
      psh_blues_scale_zones( &globals->blues, y_scale, y_delta );
    }
  }